

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CS248::DynamicScene::Mesh::check_finite_positions(Mesh *this)

{
  bool bVar1;
  pointer pVVar2;
  long in_RDI;
  bool finite;
  Vector3D position;
  VertexIter v;
  HalfedgeMesh *in_stack_ffffffffffffff68;
  allocator *in_stack_ffffffffffffff70;
  bool local_81;
  undefined1 in_stack_ffffffffffffff9f;
  string *in_stack_ffffffffffffffa0;
  string local_58 [39];
  bool local_31;
  Vector3D local_30;
  _Self local_18;
  _Self local_10 [2];
  
  if ((*(byte *)(in_RDI + 0x170) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x170) = 1;
    local_10[0]._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(in_stack_ffffffffffffff68);
    while( true ) {
      local_18._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(in_stack_ffffffffffffff68);
      bVar1 = std::operator!=(local_10,&local_18);
      if (!bVar1) break;
      pVVar2 = std::_List_iterator<CS248::Vertex>::operator->
                         ((_List_iterator<CS248::Vertex> *)in_stack_ffffffffffffff70);
      Vector3D::Vector3D(&local_30,&pVVar2->position);
      bVar1 = std::isfinite(local_30.x);
      local_81 = false;
      if (bVar1) {
        bVar1 = std::isfinite(local_30.y);
        local_81 = false;
        if (bVar1) {
          local_81 = std::isfinite(local_30.z);
        }
      }
      local_31 = local_81;
      if (local_81 == false) {
        in_stack_ffffffffffffff70 = (allocator *)&stack0xffffffffffffffa7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_58,"You set a vertex position to a non-finite value.",
                   in_stack_ffffffffffffff70);
        showError(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
        std::__cxx11::string::~string(local_58);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
      }
      std::_List_iterator<CS248::Vertex>::operator++(local_10,0);
    }
    *(undefined1 *)(in_RDI + 0x170) = 0;
  }
  return;
}

Assistant:

void Mesh::check_finite_positions() {

  // If the error triggers below, the showError() routine will internally return
  // to the draw loop to enable the GUI, but that calls mesh.draw() again, which
  // can call this method again, resulting in an infinite loop. To avoid this,
  // ensure we don't recurse.
  if(alreadyCheckingPositions) {
    return;
  }
  alreadyCheckingPositions = true;

  // Check if all vertex positions are finite
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    Vector3D position = v->position;
    bool finite = std::isfinite(position.x) && std::isfinite(position.y) && std::isfinite(position.z);

    if(!finite) {
      showError("You set a vertex position to a non-finite value.", true);
    }
  }

  alreadyCheckingPositions = false;
}